

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

longlong ImGui::RoundScalarWithFormatT<long_long>(char *format,ImGuiDataType data_type,longlong v)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  undefined8 uStack_80;
  char v_str [64];
  char fmt_sanitized [32];
  
  if ((data_type & 0xfffffffeU) == 8) {
    uStack_80 = (code *)0x181858;
    pcVar2 = ImParseFormatFindStart(format);
    if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
      uStack_80 = (code *)0x181876;
      ImParseFormatSanitizeForPrinting(pcVar2,fmt_sanitized,0x20);
      uStack_80 = (code *)0x181889;
      ImFormatString(v_str,0x40,fmt_sanitized,v);
      pcVar2 = (char *)((long)&uStack_80 + 7);
      do {
        pcVar1 = pcVar2 + 1;
        pcVar2 = pcVar2 + 1;
      } while (*pcVar1 == ' ');
      uStack_80 = (code *)0x18189d;
      dVar3 = atof(pcVar2);
      v = (longlong)dVar3;
    }
    return v;
  }
  uStack_80 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>;
  __assert_fail("data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                ,0x845,
                "TYPE ImGui::RoundScalarWithFormatT(const char *, ImGuiDataType, TYPE) [TYPE = long long]"
               );
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}